

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_putstr(wchar_t x,wchar_t y,wchar_t n,wchar_t a,char *s)

{
  errr eVar1;
  
  if (Term == (term *)0x0) {
    eVar1 = 0;
  }
  else {
    eVar1 = Term_gotoxy(x,y);
    if (eVar1 == 0) {
      eVar1 = Term_addstr(n,a,s);
      return eVar1;
    }
    eVar1 = -1;
  }
  return eVar1;
}

Assistant:

errr Term_putstr(int x, int y, int n, int a, const char *s)
{
	errr res;

	if (!Term)
		return 0;

	/* Move first */
	if ((res = Term_gotoxy(x, y)) != 0) return (res);

	/* Then add the string */
	if ((res = Term_addstr(n, a, s)) != 0) return (res);

	/* Success */
	return (0);
}